

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

void gray_render_conic(gray_PWorker worker,FT_Vector *control,FT_Vector *to)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar5;
  long to_x;
  long to_y;
  long lVar6;
  long lVar7;
  byte bVar8;
  long local_258;
  long local_250;
  long lStack_248;
  __m128i p;
  __m128i q2;
  __m128i q;
  __m128i r;
  __m128i b;
  __m128i a;
  anon_union_16_2_f9ecebec v;
  anon_union_32_2_f9ecebec u;
  int local_1ac;
  long lStack_1a8;
  FT_UInt count;
  FT_Int64 py;
  FT_Int64 px;
  FT_Int64 qy;
  FT_Int64 qx;
  FT_Int64 ry;
  FT_Int64 rx;
  int shift;
  TPos dy;
  TPos dx;
  TPos by;
  TPos bx;
  TPos ay;
  TPos ax;
  FT_Vector p2;
  FT_Vector p1;
  FT_Vector p0;
  FT_Vector *to_local;
  FT_Vector *control_local;
  gray_PWorker worker_local;
  int iVar4;
  
  lVar1 = worker->x;
  lStack_1a8 = worker->y;
  lVar5 = control->y * 4;
  to_x = to->x * 4;
  to_y = to->y * 4;
  iVar2 = (int)((ulong)lStack_1a8 >> 8);
  iVar3 = (int)((ulong)lVar5 >> 8);
  iVar4 = (int)((ulong)to_y >> 8);
  if ((((iVar2 < worker->max_ey) || (iVar3 < worker->max_ey)) || (iVar4 < worker->max_ey)) &&
     (((worker->min_ey <= iVar2 || (worker->min_ey <= iVar3)) || (worker->min_ey <= iVar4)))) {
    lVar6 = control->x * 4 - lVar1;
    q[0] = lVar5 - lStack_1a8;
    lVar5 = (to_x + control->x * -4) - lVar6;
    lVar7 = (to_y + control->y * -4) - q[0];
    local_250 = lVar5;
    if (lVar5 < 0) {
      local_250 = -lVar5;
    }
    dy = local_250;
    local_258 = lVar7;
    if (lVar7 < 0) {
      local_258 = -lVar7;
    }
    if (local_250 < local_258) {
      dy = local_258;
    }
    if (dy < 0x41) {
      gray_render_line(worker,to_x,to_y);
    }
    else {
      rx._4_4_ = 0;
      do {
        dy = dy >> 2;
        rx._4_4_ = rx._4_4_ + 1;
      } while (0x40 < dy);
      bVar8 = (byte)rx._4_4_;
      if (rx._4_4_ < 3) {
        qy = (lVar6 << (0x21 - bVar8 & 0x3f)) + (lVar5 << (bVar8 * -2 + 0x20 & 0x3f));
        px = (q[0] << (0x21 - bVar8 & 0x3f)) + (lVar7 << (bVar8 * -2 + 0x20 & 0x3f));
        py = lVar1 << 0x20;
        lStack_1a8 = lStack_1a8 << 0x20;
        for (local_1ac = 1 << (bVar8 & 0x1f); local_1ac != 0; local_1ac = local_1ac + -1) {
          py = qy + py;
          lStack_1a8 = px + lStack_1a8;
          qy = (lVar5 << (bVar8 * -2 + 0x21 & 0x3f)) + qy;
          px = (lVar7 << (bVar8 * -2 + 0x21 & 0x3f)) + px;
          gray_render_line(worker,py >> 0x20,lStack_1a8 >> 0x20);
        }
      }
      else {
        q2[1] = (lVar5 << (ulong)(rx._4_4_ * -2 + 0x20)) + (lVar6 << (ulong)(0x21 - rx._4_4_));
        a[1] = lVar1 << 0x20;
        v.vec[0] = lStack_1a8 << 0x20;
        lStack_248 = a[1];
        p[0] = v.vec[0];
        for (local_1ac = 1 << (bVar8 & 0x1f); q[0] = lVar7 + q[0], local_1ac != 0;
            local_1ac = local_1ac + -1) {
          lStack_248 = lStack_248 + q2[1];
          p[0] = p[0] + q[0];
          q2[1] = q2[1] + (lVar5 << (ulong)(rx._4_4_ * -2 + 0x21));
          v.i.px_hi = (FT_Int32)((ulong)p[0] >> 0x20);
          a[1]._4_4_ = (int)((ulong)lStack_248 >> 0x20);
          gray_render_line(worker,(long)a[1]._4_4_,(long)v.i.px_hi);
        }
      }
    }
  }
  else {
    worker->x = to_x;
    worker->y = to_y;
  }
  return;
}

Assistant:

static void
  gray_render_conic( RAS_ARG_ const FT_Vector*  control,
                              const FT_Vector*  to )
  {
    FT_Vector  p0, p1, p2;
    TPos       ax, ay, bx, by, dx, dy;
    int        shift;

    FT_Int64  rx, ry;
    FT_Int64  qx, qy;
    FT_Int64  px, py;

    FT_UInt  count;


    p0.x = ras.x;
    p0.y = ras.y;
    p1.x = UPSCALE( control->x );
    p1.y = UPSCALE( control->y );
    p2.x = UPSCALE( to->x );
    p2.y = UPSCALE( to->y );

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( p0.y ) >= ras.max_ey &&
           TRUNC( p1.y ) >= ras.max_ey &&
           TRUNC( p2.y ) >= ras.max_ey ) ||
         ( TRUNC( p0.y ) <  ras.min_ey &&
           TRUNC( p1.y ) <  ras.min_ey &&
           TRUNC( p2.y ) <  ras.min_ey ) )
    {
      ras.x = p2.x;
      ras.y = p2.y;
      return;
    }

    bx = p1.x - p0.x;
    by = p1.y - p0.y;
    ax = p2.x - p1.x - bx;  /* p0.x + p2.x - 2 * p1.x */
    ay = p2.y - p1.y - by;  /* p0.y + p2.y - 2 * p1.y */

    dx = FT_ABS( ax );
    dy = FT_ABS( ay );
    if ( dx < dy )
      dx = dy;

    if ( dx <= ONE_PIXEL / 4 )
    {
      gray_render_line( RAS_VAR_ p2.x, p2.y );
      return;
    }

    /* We can calculate the number of necessary bisections because  */
    /* each bisection predictably reduces deviation exactly 4-fold. */
    /* Even 32-bit deviation would vanish after 16 bisections.      */
    shift = 0;
    do
    {
      dx   >>= 2;
      shift += 1;

    } while ( dx > ONE_PIXEL / 4 );

    /*
     * The (P0,P1,P2) arc equation, for t in [0,1] range:
     *
     * P(t) = P0*(1-t)^2 + P1*2*t*(1-t) + P2*t^2
     *
     * P(t) = P0 + 2*(P1-P0)*t + (P0+P2-2*P1)*t^2
     *      = P0 + 2*B*t + A*t^2
     *
     *    for A = P0 + P2 - 2*P1
     *    and B = P1 - P0
     *
     * Let's consider the difference when advancing by a small
     * parameter h:
     *
     *    Q(h,t) = P(t+h) - P(t) = 2*B*h + A*h^2 + 2*A*h*t
     *
     * And then its own difference:
     *
     *    R(h,t) = Q(h,t+h) - Q(h,t) = 2*A*h*h = R (constant)
     *
     * Since R is always a constant, it is possible to compute
     * successive positions with:
     *
     *     P = P0
     *     Q = Q(h,0) = 2*B*h + A*h*h
     *     R = 2*A*h*h
     *
     *   loop:
     *     P += Q
     *     Q += R
     *     EMIT(P)
     *
     * To ensure accurate results, perform computations on 64-bit
     * values, after scaling them by 2^32.
     *
     *           h = 1 / 2^N
     *
     *     R << 32 = 2 * A << (32 - N - N)
     *             = A << (33 - 2*N)
     *
     *     Q << 32 = (2 * B << (32 - N)) + (A << (32 - N - N))
     *             = (B << (33 - N)) + (A << (32 - 2*N))
     */

#if FT_SSE2
    /* Experience shows that for small shift values, */
    /* SSE2 is actually slower.                      */
    if ( shift > 2 )
    {
      union
      {
        struct { FT_Int64  ax, ay, bx, by; }  i;
        struct { __m128i  a, b; }  vec;

      } u;

      union
      {
        struct { FT_Int32  px_lo, px_hi, py_lo, py_hi; }  i;
        __m128i  vec;

      } v;

      __m128i  a, b;
      __m128i  r, q, q2;
      __m128i  p;


      u.i.ax = ax;
      u.i.ay = ay;
      u.i.bx = bx;
      u.i.by = by;

      a = _mm_load_si128( &u.vec.a );
      b = _mm_load_si128( &u.vec.b );

      r  = _mm_slli_epi64( a, 33 - 2 * shift );
      q  = _mm_slli_epi64( b, 33 - shift );
      q2 = _mm_slli_epi64( a, 32 - 2 * shift );

      q = _mm_add_epi64( q2, q );

      v.i.px_lo = 0;
      v.i.px_hi = p0.x;
      v.i.py_lo = 0;
      v.i.py_hi = p0.y;

      p = _mm_load_si128( &v.vec );

      for ( count = 1U << shift; count > 0; count-- )
      {
        p = _mm_add_epi64( p, q );
        q = _mm_add_epi64( q, r );

        _mm_store_si128( &v.vec, p );

        gray_render_line( RAS_VAR_ v.i.px_hi, v.i.py_hi );
      }

      return;
    }
#endif  /* FT_SSE2 */

    rx = LEFT_SHIFT( ax, 33 - 2 * shift );
    ry = LEFT_SHIFT( ay, 33 - 2 * shift );

    qx = LEFT_SHIFT( bx, 33 - shift ) + LEFT_SHIFT( ax, 32 - 2 * shift );
    qy = LEFT_SHIFT( by, 33 - shift ) + LEFT_SHIFT( ay, 32 - 2 * shift );

    px = LEFT_SHIFT( p0.x, 32 );
    py = LEFT_SHIFT( p0.y, 32 );

    for ( count = 1U << shift; count > 0; count-- )
    {
      px += qx;
      py += qy;
      qx += rx;
      qy += ry;

      gray_render_line( RAS_VAR_ (FT_Pos)( px >> 32 ),
                                 (FT_Pos)( py >> 32 ) );
    }
  }